

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svo_bitset.cc
# Opt level: O0

void __thiscall gss::innards::SVOBitset::SVOBitset(SVOBitset *this,uint size,uint bits)

{
  ulong uVar1;
  void *pvVar2;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  uint i_1;
  uint i;
  uint local_18;
  uint local_14;
  
  *(uint *)(in_RDI + 0x10) = in_ESI + 0x3f >> 6;
  if (*(uint *)(in_RDI + 0x10) < 0x11) {
    for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
      in_RDI[local_14] = (ulong)in_EDX;
    }
  }
  else {
    uVar1 = SUB168(ZEXT416(in_ESI) * ZEXT816(8),0);
    if (SUB168(ZEXT416(in_ESI) * ZEXT816(8),8) != 0) {
      uVar1 = 0xffffffffffffffff;
    }
    pvVar2 = operator_new__(uVar1);
    *in_RDI = (long)pvVar2;
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      *(ulong *)(*in_RDI + (ulong)local_18 * 8) = (ulong)in_EDX;
    }
  }
  return;
}

Assistant:

SVOBitset::SVOBitset(unsigned size, unsigned bits)
{
    n_words = (size + bits_per_word - 1) / (bits_per_word);
    if (n_words <= svo_size) {
        for (unsigned i = 0; i < svo_size; ++i)
            _data.short_data[i] = bits;
    }
    else {
        _data.long_data = new BitWord[size];
        for (unsigned i = 0; i < size; ++i)
            _data.long_data[i] = bits;
    }
}